

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerFactory.cpp
# Opt level: O1

expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code> * __thiscall
jaegertracing::TracerFactory::MakeTracer
          (expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code>
           *__return_storage_ptr__,TracerFactory *this,char *configuration,string *errorMessage)

{
  int iVar1;
  InvalidNode *this_00;
  element_type *peVar2;
  Node yaml;
  Config tracerConfig;
  Node local_200;
  undefined1 local_1e0 [16];
  Config local_1d0;
  
  local_200.m_isValid = true;
  local_200.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_200.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_200.m_pNode = (node *)0x0;
  YAML::Load(&local_1d0._disabled);
  if ((local_200.m_isValid == true) && (local_1d0._disabled != false)) {
    if (((local_200.m_pNode == (node *)0x0) ||
        ((long *)local_1d0._serviceName.field_2._M_allocated_capacity == (long *)0x0)) ||
       (*(long *)local_200.m_pNode != *(long *)local_1d0._serviceName.field_2._M_allocated_capacity)
       ) {
      YAML::Node::AssignNode(&local_200,(Node *)&local_1d0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._serviceName._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1d0._serviceName._M_string_length);
    }
    Config::parse(&local_1d0,&local_200);
    if (this->_readFromEnv == true) {
      Config::fromEnv(&local_1d0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._serviceName._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)errorMessage,0,(char *)errorMessage->_M_string_length,0x232f80);
      peVar2 = DAT_00280840;
      iVar1 = opentracing::v3::invalid_configuration_error;
      __return_storage_ptr__->has_value_ = false;
      (__return_storage_ptr__->contained).m_error._M_value = iVar1;
    }
    else {
      Tracer::make((Tracer *)local_1e0,&local_1d0);
      peVar2 = (element_type *)local_1e0._8_8_;
      __return_storage_ptr__->has_value_ = true;
      (__return_storage_ptr__->contained).m_value.
      super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1e0._0_8_;
      (__return_storage_ptr__->contained).m_value.
      super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e0._8_8_ = (element_type *)0x0;
    }
    (__return_storage_ptr__->contained).m_value.
    super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
    Config::~Config(&local_1d0);
    if (local_200.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_200.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InvalidNode *)__cxa_allocate_exception(0x40);
  YAML::InvalidNode::InvalidNode(this_00);
  __cxa_throw(this_00,&YAML::InvalidNode::typeinfo,YAML::InvalidNode::~InvalidNode);
}

Assistant:

opentracing::expected<std::shared_ptr<opentracing::Tracer>>
TracerFactory::MakeTracer(const char* configuration,
                          std::string& errorMessage) const noexcept try {
#ifndef JAEGERTRACING_WITH_YAML_CPP
    errorMessage =
        "Failed to construct tracer: Jaeger was not build with yaml support.";
    return opentracing::make_unexpected(
        std::make_error_code(std::errc::not_supported));
#else
    YAML::Node yaml;
    try {
        yaml = YAML::Load(configuration);
    } catch (const YAML::ParserException& e) {
        errorMessage = e.what();
        return opentracing::make_unexpected(
            opentracing::configuration_parse_error);
    }

    auto tracerConfig = jaegertracing::Config::parse(yaml);

    if (_readFromEnv) {
        tracerConfig.fromEnv();
    }

    if (tracerConfig.serviceName().empty()) {
        errorMessage = "`service_name` not provided";
        return opentracing::make_unexpected(
            opentracing::invalid_configuration_error);
    }

    return jaegertracing::Tracer::make(tracerConfig);
#endif  // JAEGERTRACING_WITH_YAML_CPP
} catch (const std::bad_alloc&) {
    return opentracing::make_unexpected(
        std::make_error_code(std::errc::not_enough_memory));
} catch (const std::exception& e) {
    errorMessage = e.what();
    return opentracing::make_unexpected(
        opentracing::invalid_configuration_error);
}